

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::ObjectIntersectorK<8,_false>_>,_false>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  undefined4 uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar17;
  _func_int **pp_Var18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  NodeRef nodeRef;
  ulong uVar22;
  ulong uVar23;
  ulong *puVar24;
  undefined1 (*pauVar25) [32];
  ulong uVar26;
  ushort uVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  vint<8> mask;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  RTCIntersectFunctionNArguments local_2788;
  Geometry *local_2758;
  undefined8 local_2750;
  RTCIntersectArguments *local_2748;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 uStack_2610;
  ulong local_2608 [241];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  uVar22 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar22 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar33 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
      uVar23 = vpcmpeqd_avx512vl((undefined1  [32])valid_i->field_0,auVar33);
      if ((byte)uVar23 != 0) {
        auVar33 = *(undefined1 (*) [32])(ray + 0x80);
        auVar30 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar31 = *(undefined1 (*) [32])(ray + 0xc0);
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        auVar49 = ZEXT3264(local_1e80);
        auVar36 = *(undefined1 (*) [32])ray;
        auVar34._0_8_ = auVar36._0_8_ ^ 0x8000000080000000;
        auVar34._8_4_ = -auVar36._8_4_;
        auVar34._12_4_ = -auVar36._12_4_;
        auVar34._16_4_ = -auVar36._16_4_;
        auVar34._20_4_ = -auVar36._20_4_;
        auVar34._24_4_ = -auVar36._24_4_;
        auVar34._28_4_ = auVar36._28_4_ ^ 0x80000000;
        auVar28 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),
                                  SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        bVar4 = (bool)((byte)uVar23 & 1);
        local_26e0._0_4_ = (uint)bVar4 * auVar28._0_4_ | (uint)!bVar4 * 0x7f800000;
        bVar4 = (bool)((byte)(uVar23 >> 1) & 1);
        local_26e0._4_4_ = (uint)bVar4 * auVar28._4_4_ | (uint)!bVar4 * 0x7f800000;
        bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
        local_26e0._8_4_ = (uint)bVar4 * auVar28._8_4_ | (uint)!bVar4 * 0x7f800000;
        bVar4 = (bool)((byte)(uVar23 >> 3) & 1);
        local_26e0._12_4_ = (uint)bVar4 * auVar28._12_4_ | (uint)!bVar4 * 0x7f800000;
        bVar4 = (bool)((byte)(uVar23 >> 4) & 1);
        local_26e0._16_4_ = (uint)bVar4 * auVar28._16_4_ | (uint)!bVar4 * 0x7f800000;
        bVar4 = (bool)((byte)(uVar23 >> 5) & 1);
        local_26e0._20_4_ = (uint)bVar4 * auVar28._20_4_ | (uint)!bVar4 * 0x7f800000;
        bVar4 = (bool)((byte)(uVar23 >> 6) & 1);
        local_26e0._24_4_ = (uint)bVar4 * auVar28._24_4_ | (uint)!bVar4 * 0x7f800000;
        bVar4 = SUB81(uVar23 >> 7,0);
        local_26e0._28_4_ = (uint)bVar4 * auVar28._28_4_ | (uint)!bVar4 * 0x7f800000;
        auVar50 = ZEXT3264(local_26e0);
        auVar28 = *(undefined1 (*) [32])(ray + 0x20);
        auVar32 = *(undefined1 (*) [32])(ray + 0x40);
        auVar39._0_8_ = auVar32._0_8_ ^ 0x8000000080000000;
        auVar39._8_4_ = auVar32._8_4_ ^ 0x80000000;
        auVar39._12_4_ = auVar32._12_4_ ^ 0x80000000;
        auVar39._16_4_ = auVar32._16_4_ ^ 0x80000000;
        auVar39._20_4_ = auVar32._20_4_ ^ 0x80000000;
        auVar39._24_4_ = auVar32._24_4_ ^ 0x80000000;
        auVar39._28_4_ = auVar32._28_4_ ^ 0x80000000;
        uStack_2610 = 0xfffffffffffffff8;
        local_2608[0] = uVar22;
        local_1e60 = local_26e0;
        if (uVar22 != 0xfffffffffffffff8) {
          auVar40._8_4_ = 0x7fffffff;
          auVar40._0_8_ = 0x7fffffff7fffffff;
          auVar40._12_4_ = 0x7fffffff;
          auVar40._16_4_ = 0x7fffffff;
          auVar40._20_4_ = 0x7fffffff;
          auVar40._24_4_ = 0x7fffffff;
          auVar40._28_4_ = 0x7fffffff;
          auVar32 = vandps_avx(auVar33,auVar40);
          auVar44._8_4_ = 0x219392ef;
          auVar44._0_8_ = 0x219392ef219392ef;
          auVar44._12_4_ = 0x219392ef;
          auVar44._16_4_ = 0x219392ef;
          auVar44._20_4_ = 0x219392ef;
          auVar44._24_4_ = 0x219392ef;
          auVar44._28_4_ = 0x219392ef;
          uVar23 = vcmpps_avx512vl(auVar32,auVar44,1);
          bVar4 = (bool)((byte)uVar23 & 1);
          auVar32._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar33._0_4_;
          bVar4 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar32._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar33._4_4_;
          bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar32._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar33._8_4_;
          bVar4 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar32._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar33._12_4_;
          bVar4 = (bool)((byte)(uVar23 >> 4) & 1);
          auVar32._16_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar33._16_4_;
          bVar4 = (bool)((byte)(uVar23 >> 5) & 1);
          auVar32._20_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar33._20_4_;
          bVar4 = (bool)((byte)(uVar23 >> 6) & 1);
          auVar32._24_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar33._24_4_;
          bVar4 = SUB81(uVar23 >> 7,0);
          auVar32._28_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar33._28_4_;
          auVar33 = vandps_avx(auVar30,auVar40);
          uVar23 = vcmpps_avx512vl(auVar33,auVar44,1);
          bVar4 = (bool)((byte)uVar23 & 1);
          auVar29._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar30._0_4_;
          bVar4 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar29._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar30._4_4_;
          bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar29._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar30._8_4_;
          bVar4 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar29._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar30._12_4_;
          bVar4 = (bool)((byte)(uVar23 >> 4) & 1);
          auVar29._16_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar30._16_4_;
          bVar4 = (bool)((byte)(uVar23 >> 5) & 1);
          auVar29._20_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar30._20_4_;
          bVar4 = (bool)((byte)(uVar23 >> 6) & 1);
          auVar29._24_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar30._24_4_;
          bVar4 = SUB81(uVar23 >> 7,0);
          auVar29._28_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar30._28_4_;
          auVar33 = vandps_avx(auVar31,auVar40);
          uVar23 = vcmpps_avx512vl(auVar33,auVar44,1);
          bVar4 = (bool)((byte)uVar23 & 1);
          auVar33._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar31._0_4_;
          bVar4 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar33._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar31._4_4_;
          bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar33._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar31._8_4_;
          bVar4 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar33._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar31._12_4_;
          bVar4 = (bool)((byte)(uVar23 >> 4) & 1);
          auVar33._16_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar31._16_4_;
          bVar4 = (bool)((byte)(uVar23 >> 5) & 1);
          auVar33._20_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar31._20_4_;
          bVar4 = (bool)((byte)(uVar23 >> 6) & 1);
          auVar33._24_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar31._24_4_;
          bVar4 = SUB81(uVar23 >> 7,0);
          auVar33._28_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar31._28_4_;
          auVar30 = vrcp14ps_avx512vl(auVar32);
          auVar42._8_4_ = 0x3f800000;
          auVar42._0_8_ = 0x3f8000003f800000;
          auVar42._12_4_ = 0x3f800000;
          auVar42._16_4_ = 0x3f800000;
          auVar42._20_4_ = 0x3f800000;
          auVar42._24_4_ = 0x3f800000;
          auVar42._28_4_ = 0x3f800000;
          auVar14 = vfnmadd213ps_fma(auVar32,auVar30,auVar42);
          auVar31 = vrcp14ps_avx512vl(auVar29);
          auVar15 = vfnmadd213ps_fma(auVar29,auVar31,auVar42);
          auVar32 = vrcp14ps_avx512vl(auVar33);
          auVar16 = vfnmadd213ps_fma(auVar33,auVar32,auVar42);
          auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar30,auVar30);
          auVar46 = ZEXT1664(auVar14);
          auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar31,auVar31);
          auVar47 = ZEXT1664(auVar15);
          auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar32,auVar32);
          auVar48 = ZEXT1664(auVar16);
          local_2700._4_4_ = auVar14._4_4_ * -auVar36._4_4_;
          local_2700._0_4_ = auVar14._0_4_ * -auVar36._0_4_;
          local_2700._8_4_ = auVar14._8_4_ * auVar34._8_4_;
          local_2700._12_4_ = auVar14._12_4_ * auVar34._12_4_;
          local_2700._16_4_ = auVar34._16_4_ * 0.0;
          local_2700._20_4_ = auVar34._20_4_ * 0.0;
          local_2700._24_4_ = auVar34._24_4_ * 0.0;
          local_2700._28_4_ = auVar32._28_4_;
          auVar45 = ZEXT3264(local_2700);
          auVar51._0_4_ = auVar15._0_4_ * -auVar28._0_4_;
          auVar51._4_4_ = auVar15._4_4_ * -auVar28._4_4_;
          auVar51._8_4_ = auVar15._8_4_ * -auVar28._8_4_;
          auVar51._12_4_ = auVar15._12_4_ * -auVar28._12_4_;
          auVar51._16_4_ = -auVar28._16_4_ * 0.0;
          auVar51._20_4_ = -auVar28._20_4_ * 0.0;
          auVar51._28_36_ = in_ZMM15._28_36_;
          auVar51._24_4_ = -auVar28._24_4_ * 0.0;
          local_2720 = auVar51._0_32_;
          auVar51 = ZEXT3264(local_2720);
          local_26c0 = ZEXT1632(auVar16);
          local_2740 = vmulps_avx512vl(local_26c0,auVar39);
          auVar52 = ZEXT3264(local_2740);
          auVar33 = vpcmpeqd_avx2(auVar34,auVar34);
          uVar23 = vpcmpeqd_avx512vl((undefined1  [32])valid_i->field_0,auVar33);
          auVar33 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          puVar24 = local_2608;
          auVar30 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),
                                    SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          bVar4 = (bool)((byte)uVar23 & 1);
          bVar5 = (bool)((byte)(uVar23 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar23 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar23 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar23 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar23 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar23 >> 6) & 1);
          bVar11 = SUB81(uVar23 >> 7,0);
          auVar53 = ZEXT3264(CONCAT428((uint)bVar11 * auVar30._28_4_ |
                                       (uint)!bVar11 * auVar33._28_4_,
                                       CONCAT424((uint)bVar10 * auVar30._24_4_ |
                                                 (uint)!bVar10 * auVar33._24_4_,
                                                 CONCAT420((uint)bVar9 * auVar30._20_4_ |
                                                           (uint)!bVar9 * auVar33._20_4_,
                                                           CONCAT416((uint)bVar8 * auVar30._16_4_ |
                                                                     (uint)!bVar8 * auVar33._16_4_,
                                                                     CONCAT412((uint)bVar7 *
                                                                               auVar30._12_4_ |
                                                                               (uint)!bVar7 *
                                                                               auVar33._12_4_,
                                                                               CONCAT48((uint)bVar6
                                                                                        * auVar30.
                                                  _8_4_ | (uint)!bVar6 * auVar33._8_4_,
                                                  CONCAT44((uint)bVar5 * auVar30._4_4_ |
                                                           (uint)!bVar5 * auVar33._4_4_,
                                                           (uint)bVar4 * auVar30._0_4_ |
                                                           (uint)!bVar4 * auVar33._0_4_))))))));
          pauVar25 = (undefined1 (*) [32])local_1e40;
          local_2680 = ZEXT1632(auVar14);
          local_26a0 = ZEXT1632(auVar15);
          do {
            pauVar1 = pauVar25 + -1;
            auVar38 = ZEXT3264(*pauVar1);
            pauVar25 = pauVar25 + -1;
            auVar33 = auVar53._0_32_;
            uVar12 = vcmpps_avx512vl(*pauVar1,auVar33,1);
            if ((char)uVar12 != '\0') {
              while ((uVar22 & 8) == 0) {
                lVar19 = 0;
                uVar17 = 0;
                auVar38 = ZEXT3264(auVar49._0_32_);
                uVar23 = 8;
                do {
                  uVar26 = *(ulong *)((uVar22 & 0xfffffffffffffff0) + lVar19 * 8);
                  if (uVar26 == 8) break;
                  uVar2 = *(undefined4 *)(uVar22 + 0x20 + lVar19 * 4);
                  auVar30._4_4_ = uVar2;
                  auVar30._0_4_ = uVar2;
                  auVar30._8_4_ = uVar2;
                  auVar30._12_4_ = uVar2;
                  auVar30._16_4_ = uVar2;
                  auVar30._20_4_ = uVar2;
                  auVar30._24_4_ = uVar2;
                  auVar30._28_4_ = uVar2;
                  auVar14 = vfmadd132ps_fma(auVar30,auVar45._0_32_,auVar46._0_32_);
                  uVar2 = *(undefined4 *)(uVar22 + 0x40 + lVar19 * 4);
                  auVar31._4_4_ = uVar2;
                  auVar31._0_4_ = uVar2;
                  auVar31._8_4_ = uVar2;
                  auVar31._12_4_ = uVar2;
                  auVar31._16_4_ = uVar2;
                  auVar31._20_4_ = uVar2;
                  auVar31._24_4_ = uVar2;
                  auVar31._28_4_ = uVar2;
                  auVar15 = vfmadd132ps_fma(auVar31,auVar51._0_32_,auVar47._0_32_);
                  uVar2 = *(undefined4 *)(uVar22 + 0x60 + lVar19 * 4);
                  auVar36._4_4_ = uVar2;
                  auVar36._0_4_ = uVar2;
                  auVar36._8_4_ = uVar2;
                  auVar36._12_4_ = uVar2;
                  auVar36._16_4_ = uVar2;
                  auVar36._20_4_ = uVar2;
                  auVar36._24_4_ = uVar2;
                  auVar36._28_4_ = uVar2;
                  auVar32 = vfmadd132ps_avx512vl(auVar36,auVar52._0_32_,auVar48._0_32_);
                  uVar2 = *(undefined4 *)(uVar22 + 0x30 + lVar19 * 4);
                  auVar28._4_4_ = uVar2;
                  auVar28._0_4_ = uVar2;
                  auVar28._8_4_ = uVar2;
                  auVar28._12_4_ = uVar2;
                  auVar28._16_4_ = uVar2;
                  auVar28._20_4_ = uVar2;
                  auVar28._24_4_ = uVar2;
                  auVar28._28_4_ = uVar2;
                  auVar16 = vfmadd132ps_fma(auVar28,auVar45._0_32_,auVar46._0_32_);
                  uVar2 = *(undefined4 *)(uVar22 + 0x50 + lVar19 * 4);
                  auVar41._4_4_ = uVar2;
                  auVar41._0_4_ = uVar2;
                  auVar41._8_4_ = uVar2;
                  auVar41._12_4_ = uVar2;
                  auVar41._16_4_ = uVar2;
                  auVar41._20_4_ = uVar2;
                  auVar41._24_4_ = uVar2;
                  auVar41._28_4_ = uVar2;
                  auVar13 = vfmadd132ps_fma(auVar41,auVar51._0_32_,auVar47._0_32_);
                  uVar2 = *(undefined4 *)(uVar22 + 0x70 + lVar19 * 4);
                  auVar43._4_4_ = uVar2;
                  auVar43._0_4_ = uVar2;
                  auVar43._8_4_ = uVar2;
                  auVar43._12_4_ = uVar2;
                  auVar43._16_4_ = uVar2;
                  auVar43._20_4_ = uVar2;
                  auVar43._24_4_ = uVar2;
                  auVar43._28_4_ = uVar2;
                  auVar34 = vfmadd132ps_avx512vl(auVar43,auVar52._0_32_,auVar48._0_32_);
                  auVar30 = vpminsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar16));
                  auVar31 = vpminsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar13));
                  auVar30 = vpmaxsd_avx2(auVar30,auVar31);
                  auVar31 = vpminsd_avx2(auVar32,auVar34);
                  auVar30 = vpmaxsd_avx2(auVar30,auVar31);
                  auVar31 = vpmaxsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar16));
                  auVar36 = vpmaxsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar13));
                  auVar28 = vpminsd_avx2(auVar31,auVar36);
                  auVar31 = vpmaxsd_avx2(auVar32,auVar34);
                  auVar36 = vpmaxsd_avx2(auVar30,auVar50._0_32_);
                  auVar31 = vpminsd_avx512vl(auVar31,auVar33);
                  auVar31 = vpminsd_avx2(auVar28,auVar31);
                  uVar20 = vpcmpd_avx512vl(auVar36,auVar31,2);
                  if ((byte)uVar20 != 0) {
                    auVar31 = vblendmps_avx512vl(auVar49._0_32_,auVar30);
                    bVar4 = (bool)((byte)uVar20 & 1);
                    auVar35._0_4_ = (uint)bVar4 * auVar31._0_4_ | (uint)!bVar4 * auVar30._0_4_;
                    bVar4 = (bool)((byte)(uVar20 >> 1) & 1);
                    auVar35._4_4_ = (uint)bVar4 * auVar31._4_4_ | (uint)!bVar4 * auVar30._4_4_;
                    bVar4 = (bool)((byte)(uVar20 >> 2) & 1);
                    auVar35._8_4_ = (uint)bVar4 * auVar31._8_4_ | (uint)!bVar4 * auVar30._8_4_;
                    bVar4 = (bool)((byte)(uVar20 >> 3) & 1);
                    auVar35._12_4_ = (uint)bVar4 * auVar31._12_4_ | (uint)!bVar4 * auVar30._12_4_;
                    bVar4 = (bool)((byte)(uVar20 >> 4) & 1);
                    auVar35._16_4_ = (uint)bVar4 * auVar31._16_4_ | (uint)!bVar4 * auVar30._16_4_;
                    bVar4 = (bool)((byte)(uVar20 >> 5) & 1);
                    auVar35._20_4_ = (uint)bVar4 * auVar31._20_4_ | (uint)!bVar4 * auVar30._20_4_;
                    bVar4 = (bool)((byte)(uVar20 >> 6) & 1);
                    auVar35._24_4_ = (uint)bVar4 * auVar31._24_4_ | (uint)!bVar4 * auVar30._24_4_;
                    bVar4 = SUB81(uVar20 >> 7,0);
                    auVar35._28_4_ = (uint)bVar4 * auVar31._28_4_ | (uint)!bVar4 * auVar30._28_4_;
                    auVar36 = auVar38._0_32_;
                    uVar12 = vcmpps_avx512vl(auVar35,auVar36,1);
                    uVar20 = uVar23;
                    uVar21 = uVar26;
                    auVar31 = auVar36;
                    auVar30 = auVar35;
                    if (((char)uVar12 == '\0') ||
                       (uVar20 = uVar26, uVar21 = uVar23, auVar31 = auVar35, auVar30 = auVar36,
                       uVar23 != 8)) {
                      auVar35 = auVar31;
                      uVar17 = uVar17 + 1;
                      *puVar24 = uVar21;
                      puVar24 = puVar24 + 1;
                      *pauVar25 = auVar30;
                      pauVar25 = pauVar25 + 1;
                      uVar26 = uVar20;
                    }
                    auVar38 = ZEXT3264(auVar35);
                    uVar23 = uVar26;
                  }
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 4);
                if (uVar23 == 8) goto LAB_00710597;
                uVar22 = uVar23;
                if (1 < uVar17) {
                  auVar36 = pauVar25[-2];
                  auVar30 = pauVar25[-1];
                  uVar12 = vcmpps_avx512vl(auVar36,auVar30,1);
                  auVar31 = auVar30;
                  if ((char)uVar12 != '\0') {
                    pauVar25[-2] = auVar30;
                    pauVar25[-1] = auVar36;
                    auVar14 = vpermilps_avx(*(undefined1 (*) [16])(puVar24 + -2),0x4e);
                    *(undefined1 (*) [16])(puVar24 + -2) = auVar14;
                    auVar31 = auVar36;
                    auVar36 = auVar30;
                  }
                  if (uVar17 != 2) {
                    auVar30 = pauVar25[-3];
                    uVar12 = vcmpps_avx512vl(auVar30,auVar31,1);
                    if ((char)uVar12 != '\0') {
                      pauVar25[-3] = auVar31;
                      pauVar25[-1] = auVar30;
                      uVar23 = puVar24[-3];
                      puVar24[-3] = puVar24[-1];
                      puVar24[-1] = uVar23;
                      auVar30 = auVar31;
                    }
                    uVar12 = vcmpps_avx512vl(auVar30,auVar36,1);
                    if ((char)uVar12 != '\0') {
                      pauVar25[-3] = auVar36;
                      pauVar25[-2] = auVar30;
                      auVar14 = vpermilps_avx(*(undefined1 (*) [16])(puVar24 + -3),0x4e);
                      *(undefined1 (*) [16])(puVar24 + -3) = auVar14;
                    }
                  }
                }
              }
              if (uVar22 == 0xfffffffffffffff8) {
                return;
              }
              uVar23 = vcmpps_avx512vl(auVar33,auVar38._0_32_,6);
              uVar27 = (ushort)uVar23;
              if ((byte)uVar23 != 0) {
                uVar17 = (ulong)((uint)uVar22 & 0xf);
                if (uVar17 != 8) {
                  lVar19 = 0;
                  local_2660 = auVar33;
                  do {
                    local_2788.geomID = *(uint *)((uVar22 & 0xfffffffffffffff0) + lVar19 * 8);
                    local_2758 = (context->scene->geometries).items[local_2788.geomID].ptr;
                    uVar3 = local_2758->mask;
                    auVar37._4_4_ = uVar3;
                    auVar37._0_4_ = uVar3;
                    auVar37._8_4_ = uVar3;
                    auVar37._12_4_ = uVar3;
                    auVar37._16_4_ = uVar3;
                    auVar37._20_4_ = uVar3;
                    auVar37._24_4_ = uVar3;
                    auVar37._28_4_ = uVar3;
                    uVar26 = vptestmd_avx512vl(auVar37,*(undefined1 (*) [32])(ray + 0x120));
                    uVar26 = uVar23 & 0xff & uVar26;
                    if ((char)uVar26 != '\0') {
                      local_2788.primID = *(uint *)((uVar22 & 0xfffffffffffffff0) + 4 + lVar19 * 8);
                      local_2640 = vpmovm2d_avx512vl(uVar26);
                      local_2788.valid = (int *)local_2640;
                      local_2788.geometryUserPtr = local_2758->userPtr;
                      local_2788.context = context->user;
                      local_2788.N = 8;
                      local_2750 = 0;
                      local_2748 = context->args;
                      pp_Var18 = (_func_int **)local_2748->intersect;
                      if (pp_Var18 == (_func_int **)0x0) {
                        pp_Var18 = local_2758[1].super_RefCount._vptr_RefCount;
                      }
                      local_2788.rayhit = (RTCRayHitN *)ray;
                      (*(code *)pp_Var18)(&local_2788);
                      auVar46 = ZEXT3264(local_2680);
                      auVar47 = ZEXT3264(local_26a0);
                      auVar48 = ZEXT3264(local_26c0);
                      auVar49 = ZEXT3264(CONCAT428(0x7f800000,
                                                   CONCAT424(0x7f800000,
                                                             CONCAT420(0x7f800000,
                                                                       CONCAT416(0x7f800000,
                                                                                 CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                      auVar50 = ZEXT3264(local_26e0);
                      auVar45 = ZEXT3264(local_2700);
                      auVar51 = ZEXT3264(local_2720);
                      auVar52 = ZEXT3264(local_2740);
                      auVar53 = ZEXT3264(local_2660);
                    }
                    auVar33 = auVar53._0_32_;
                    lVar19 = lVar19 + 1;
                  } while (uVar17 - 8 != lVar19);
                }
                bVar4 = (bool)((byte)uVar23 & 1);
                bVar5 = (bool)((byte)(uVar27 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar27 >> 2) & 1);
                bVar7 = (bool)((byte)(uVar27 >> 3) & 1);
                bVar8 = (bool)((byte)(uVar27 >> 4) & 1);
                bVar9 = (bool)((byte)(uVar27 >> 5) & 1);
                bVar10 = (bool)((byte)(uVar27 >> 6) & 1);
                bVar11 = (bool)((byte)(uVar27 >> 7) & 1);
                auVar53 = ZEXT3264(CONCAT428((uint)bVar11 * *(int *)(ray + 0x11c) |
                                             (uint)!bVar11 * auVar33._28_4_,
                                             CONCAT424((uint)bVar10 * *(int *)(ray + 0x118) |
                                                       (uint)!bVar10 * auVar33._24_4_,
                                                       CONCAT420((uint)bVar9 * *(int *)(ray + 0x114)
                                                                 | (uint)!bVar9 * auVar33._20_4_,
                                                                 CONCAT416((uint)bVar8 *
                                                                           *(int *)(ray + 0x110) |
                                                                           (uint)!bVar8 *
                                                                           auVar33._16_4_,
                                                                           CONCAT412((uint)bVar7 *
                                                                                     *(int *)(ray + 
                                                  0x10c) | (uint)!bVar7 * auVar33._12_4_,
                                                  CONCAT48((uint)bVar6 * *(int *)(ray + 0x108) |
                                                           (uint)!bVar6 * auVar33._8_4_,
                                                           CONCAT44((uint)bVar5 *
                                                                    *(int *)(ray + 0x104) |
                                                                    (uint)!bVar5 * auVar33._4_4_,
                                                                    (uint)bVar4 *
                                                                    *(int *)(ray + 0x100) |
                                                                    (uint)!bVar4 * auVar33._0_4_))))
                                                  ))));
              }
            }
LAB_00710597:
            uVar22 = puVar24[-1];
            puVar24 = puVar24 + -1;
          } while (uVar22 != 0xfffffffffffffff8);
        }
      }
    }
    else {
      intersectCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }